

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O1

unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_>
s2textformat::MakePolylineOrDie(string_view str,S2Debug debug_override)

{
  bool bVar1;
  ostream *poVar2;
  unique_ptr<S2Polyline,_std::default_delete<S2Polyline>_> *in_RCX;
  size_type sVar3;
  undefined7 in_register_00000011;
  __uniq_ptr_data<S2Polyline,_std::default_delete<S2Polyline>,_true,_true> _Var4;
  S2Debug in_R8B;
  string_view str_00;
  string_view piece;
  S2LogMessage SStack_38;
  
  piece.ptr_ = (char *)CONCAT71(in_register_00000011,debug_override);
  _Var4.super___uniq_ptr_impl<S2Polyline,_std::default_delete<S2Polyline>_>._M_t.
  super__Tuple_impl<0UL,_S2Polyline_*,_std::default_delete<S2Polyline>_>.
  super__Head_base<0UL,_S2Polyline_*,_false>._M_head_impl =
       (__uniq_ptr_impl<S2Polyline,_std::default_delete<S2Polyline>_>)str.ptr_;
  *(undefined8 *)
   _Var4.super___uniq_ptr_impl<S2Polyline,_std::default_delete<S2Polyline>_>._M_t.
   super__Tuple_impl<0UL,_S2Polyline_*,_std::default_delete<S2Polyline>_>.
   super__Head_base<0UL,_S2Polyline_*,_false>._M_head_impl = 0;
  str_00.length_ =
       (size_type)
       _Var4.super___uniq_ptr_impl<S2Polyline,_std::default_delete<S2Polyline>_>._M_t.
       super__Tuple_impl<0UL,_S2Polyline_*,_std::default_delete<S2Polyline>_>.
       super__Head_base<0UL,_S2Polyline_*,_false>._M_head_impl;
  str_00.ptr_ = piece.ptr_;
  bVar1 = MakePolyline((s2textformat *)str.length_,str_00,in_RCX,in_R8B);
  if (!bVar1) {
    sVar3 = 3;
    S2LogMessage::S2LogMessage
              (&SStack_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2text_format.cc"
               ,0xc1,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (SStack_38.stream_,"Check failed: MakePolyline(str, &polyline, debug_override) ",0x3b)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(SStack_38.stream_,": str == \"",10);
    piece.length_ = sVar3;
    poVar2 = absl::operator<<((absl *)SStack_38.stream_,(ostream *)str.length_,piece);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
    if (!bVar1) {
      abort();
    }
  }
  return (__uniq_ptr_data<S2Polyline,_std::default_delete<S2Polyline>,_true,_true>)
         (tuple<S2Polyline_*,_std::default_delete<S2Polyline>_>)
         _Var4.super___uniq_ptr_impl<S2Polyline,_std::default_delete<S2Polyline>_>._M_t.
         super__Tuple_impl<0UL,_S2Polyline_*,_std::default_delete<S2Polyline>_>.
         super__Head_base<0UL,_S2Polyline_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<S2Polyline> MakePolylineOrDie(string_view str,
                                         S2Debug debug_override) {
  unique_ptr<S2Polyline> polyline;
  S2_CHECK(MakePolyline(str, &polyline, debug_override))
      << ": str == \"" << str << "\"";
  return polyline;
}